

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O0

Factor * __thiscall libDAI::NDP::GetFactor(NDP *this,size_t i)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *in_RSI;
  size_type in_RDI;
  size_t nrOFs;
  undefined8 local_8;
  
  this_00 = (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
            (**(code **)(**(long **)(in_RDI + 0x1a8) + 0x48))();
  if (in_RSI < this_00) {
    local_8 = (const_reference)
              (**(code **)(**(long **)(in_RDI + 0x1a8) + 0x50))(*(long **)(in_RDI + 0x1a8),in_RSI);
  }
  else {
    local_8 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                        (this_00,in_RDI);
  }
  return local_8;
}

Assistant:

const Factor & GetFactor(size_t i) const
            {
                //nr of Original Factors:
                size_t nrOFs = _g->nrFactors();
                if(i < nrOFs)
                    return (_g->factor(i));
                else
                    return ( _m_newFacs.at(i - nrOFs) );
            }